

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O0

ImGuiWindowSettings * ImGui::FindWindowSettings(ImGuiID id)

{
  ImGuiContext *pIVar1;
  value_type *pvVar2;
  int local_24;
  int i;
  ImGuiContext *g;
  ImGuiID id_local;
  
  pIVar1 = GImGui;
  local_24 = 0;
  while( true ) {
    if (local_24 == (pIVar1->SettingsWindows).Size) {
      return (ImGuiWindowSettings *)0x0;
    }
    pvVar2 = ImVector<ImGuiWindowSettings>::operator[](&pIVar1->SettingsWindows,local_24);
    if (pvVar2->Id == id) break;
    local_24 = local_24 + 1;
  }
  pvVar2 = ImVector<ImGuiWindowSettings>::operator[](&pIVar1->SettingsWindows,local_24);
  return pvVar2;
}

Assistant:

ImGuiWindowSettings* ImGui::FindWindowSettings(ImGuiID id)
{
    ImGuiContext& g = *GImGui;
    for (int i = 0; i != g.SettingsWindows.Size; i++)
        if (g.SettingsWindows[i].Id == id)
            return &g.SettingsWindows[i];
    return NULL;
}